

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O0

void __thiscall CommandLineTestRunner::initializeTestRun(CommandLineTestRunner *this)

{
  long *plVar1;
  bool bVar2;
  TestFilter *pTVar3;
  long in_RDI;
  
  plVar1 = *(long **)(in_RDI + 0x18);
  pTVar3 = CommandLineArguments::getGroupFilters(*(CommandLineArguments **)(in_RDI + 0x10));
  (**(code **)(*plVar1 + 0x60))(plVar1,pTVar3);
  plVar1 = *(long **)(in_RDI + 0x18);
  pTVar3 = CommandLineArguments::getNameFilters(*(CommandLineArguments **)(in_RDI + 0x10));
  (**(code **)(*plVar1 + 0x58))(plVar1,pTVar3);
  bVar2 = CommandLineArguments::isVerbose(*(CommandLineArguments **)(in_RDI + 0x10));
  if (bVar2) {
    (**(code **)(**(long **)(in_RDI + 8) + 0x40))(*(long **)(in_RDI + 8),1);
  }
  bVar2 = CommandLineArguments::isVeryVerbose(*(CommandLineArguments **)(in_RDI + 0x10));
  if (bVar2) {
    (**(code **)(**(long **)(in_RDI + 8) + 0x40))(*(long **)(in_RDI + 8),2);
  }
  bVar2 = CommandLineArguments::isColor(*(CommandLineArguments **)(in_RDI + 0x10));
  if (bVar2) {
    (**(code **)(**(long **)(in_RDI + 8) + 0x48))();
  }
  bVar2 = CommandLineArguments::runTestsInSeperateProcess(*(CommandLineArguments **)(in_RDI + 0x10))
  ;
  if (bVar2) {
    (**(code **)(**(long **)(in_RDI + 0x18) + 0xc0))();
  }
  bVar2 = CommandLineArguments::isRunIgnored(*(CommandLineArguments **)(in_RDI + 0x10));
  if (bVar2) {
    TestRegistry::setRunIgnored(*(TestRegistry **)(in_RDI + 0x18));
  }
  bVar2 = CommandLineArguments::isCrashingOnFail(*(CommandLineArguments **)(in_RDI + 0x10));
  if (bVar2) {
    UtestShell::setCrashOnFail();
  }
  return;
}

Assistant:

void CommandLineTestRunner::initializeTestRun()
{
    registry_->setGroupFilters(arguments_->getGroupFilters());
    registry_->setNameFilters(arguments_->getNameFilters());

    if (arguments_->isVerbose()) output_->verbose(TestOutput::level_verbose);
    if (arguments_->isVeryVerbose()) output_->verbose(TestOutput::level_veryVerbose);
    if (arguments_->isColor()) output_->color();
    if (arguments_->runTestsInSeperateProcess()) registry_->setRunTestsInSeperateProcess();
    if (arguments_->isRunIgnored()) registry_->setRunIgnored();
    if (arguments_->isCrashingOnFail()) UtestShell::setCrashOnFail();
}